

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

SAttribute * __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *name)

{
  SAttribute *pSVar1;
  unsigned_long *puVar2;
  bool bVar3;
  long lVar4;
  SAttribute *pSVar5;
  long lVar6;
  unsigned_long uVar7;
  long lVar8;
  string<unsigned_long> n;
  string<unsigned_long> local_28;
  
  if (name == (unsigned_long *)0x0) {
    pSVar5 = (SAttribute *)0x0;
  }
  else {
    local_28.array = (unsigned_long *)0x0;
    local_28.allocated = 0;
    local_28.used = 0;
    core::string<unsigned_long>::operator=(&local_28,name);
    lVar4 = (long)(int)(this->Attributes).used;
    if (0 < lVar4) {
      pSVar1 = (this->Attributes).data;
      lVar6 = 0;
      do {
        puVar2 = pSVar1[lVar6].Name.array;
        uVar7 = *puVar2;
        bVar3 = true;
        if (uVar7 != 0) {
          lVar8 = 0;
          do {
            if (*(unsigned_long *)((long)local_28.array + lVar8) == 0) break;
            if (uVar7 != *(unsigned_long *)((long)local_28.array + lVar8)) {
              bVar3 = false;
              break;
            }
            uVar7 = *(unsigned_long *)((long)puVar2 + lVar8 + 8);
            lVar8 = lVar8 + 8;
          } while (uVar7 != 0);
        }
        if ((bVar3) && (pSVar5 = pSVar1 + lVar6, (pSVar5->Name).used == local_28.used))
        goto LAB_006bfa93;
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar4);
    }
    pSVar5 = (SAttribute *)0x0;
LAB_006bfa93:
    if (local_28.array != (unsigned_long *)0x0) {
      operator_delete__(local_28.array);
    }
  }
  return pSVar5;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}